

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

void ZSTD_row_update(ZSTD_matchState_t *ms,BYTE *ip)

{
  U32 UVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  char cVar5;
  byte bVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  
  uVar9 = (ms->cParams).searchLog;
  if (5 < uVar9) {
    uVar9 = 6;
  }
  uVar8 = 4;
  if (4 < uVar9) {
    uVar8 = uVar9;
  }
  uVar9 = (ms->cParams).minMatch;
  uVar14 = 6;
  if (uVar9 < 6) {
    uVar14 = uVar9;
  }
  uVar16 = (ulong)ms->nextToUpdate;
  pBVar2 = (ms->window).base;
  uVar9 = (uint)((long)ip - (long)pBVar2);
  if (uVar9 < ms->nextToUpdate) {
    __assert_fail("target >= idx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x397,
                  "void ZSTD_row_update_internal(ZSTD_matchState_t *, const BYTE *, const U32, const U32, const U32, const U32)"
                 );
  }
  uVar15 = ~(-1 << ((byte)uVar8 & 0x1f));
  pUVar3 = ms->hashTable;
  pBVar4 = ms->tagTable;
  UVar1 = ms->rowHashLog;
  cVar5 = (char)UVar1;
  bVar6 = 0x38 - cVar5;
  bVar7 = 0x18 - cVar5;
  do {
    if (((long)ip - (long)pBVar2 & 0xffffffffU) <= uVar16) {
      ms->nextToUpdate = uVar9;
      return;
    }
    if (0x20 < UVar1 + 8) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    if (uVar14 == 5) {
      uVar11 = *(long *)(pBVar2 + uVar16) * -0x30e4432345000000;
LAB_001bebb3:
      uVar10 = (uint)((uVar11 ^ ms->hashSalt) >> (bVar6 & 0x3f));
    }
    else {
      if (uVar14 == 6) {
        uVar11 = *(long *)(pBVar2 + uVar16) * -0x30e4432340650000;
        goto LAB_001bebb3;
      }
      uVar10 = (*(int *)(pBVar2 + uVar16) * -0x61c8864f ^ (uint)ms->hashSalt) >> (bVar7 & 0x1f);
    }
    lVar17 = (ulong)(uVar10 >> 8) << ((byte)uVar8 & 0x3f);
    uVar12 = pBVar4[lVar17] + 0x7f & uVar15;
    uVar11 = 0;
    if (uVar12 == 0) {
      uVar11 = (ulong)uVar15;
    }
    lVar13 = uVar12 + uVar11;
    pBVar4[lVar17] = (BYTE)lVar13;
    if (uVar14 == 5) {
      uVar11 = *(long *)(pBVar2 + uVar16) * -0x30e4432345000000;
LAB_001bec5e:
      uVar11 = (uVar11 ^ ms->hashSalt) >> (bVar6 & 0x3f);
    }
    else {
      if (uVar14 == 6) {
        uVar11 = *(long *)(pBVar2 + uVar16) * -0x30e4432340650000;
        goto LAB_001bec5e;
      }
      uVar11 = (ulong)((*(int *)(pBVar2 + uVar16) * -0x61c8864f ^ (uint)ms->hashSalt) >>
                      (bVar7 & 0x1f));
    }
    if (uVar11 != uVar10) {
      __assert_fail("hash == ZSTD_hashPtrSalted(base + updateStartIdx, hashLog + ZSTD_ROW_HASH_TAG_BITS, mls, ms->hashSalt)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                    ,0x375,
                    "void ZSTD_row_update_internalImpl(ZSTD_matchState_t *, U32, const U32, const U32, const U32, const U32, const U32)"
                   );
    }
    pBVar4[lVar13 + lVar17] = (BYTE)uVar10;
    pUVar3[lVar17 + lVar13] = (U32)uVar16;
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void ZSTD_row_update(ZSTD_matchState_t* const ms, const BYTE* ip) {
    const U32 rowLog = BOUNDED(4, ms->cParams.searchLog, 6);
    const U32 rowMask = (1u << rowLog) - 1;
    const U32 mls = MIN(ms->cParams.minMatch, 6 /* mls caps out at 6 */);

    DEBUGLOG(5, "ZSTD_row_update(), rowLog=%u", rowLog);
    ZSTD_row_update_internal(ms, ip, mls, rowLog, rowMask, 0 /* don't use cache */);
}